

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_file.c
# Opt level: O3

ion_err_t flat_file_write_row(ion_flat_file_t *flat_file,ion_fpos_t location,
                             ion_flat_file_row_t *row)

{
  int iVar1;
  size_t sVar2;
  ion_err_t iVar3;
  
  flat_file->current_loaded_region = -1;
  flat_file->num_in_buffer = 0;
  iVar1 = fseek((FILE *)flat_file->data_file,
                location * flat_file->row_size + flat_file->start_of_data,0);
  iVar3 = '\r';
  if (iVar1 == 0) {
    sVar2 = fwrite(row,1,1,(FILE *)flat_file->data_file);
    iVar3 = '\a';
    if (sVar2 == 1) {
      if ((row->key != (void *)0x0) &&
         (sVar2 = fwrite(row->key,(long)(flat_file->super).record.key_size,1,
                         (FILE *)flat_file->data_file), sVar2 != 1)) {
        return '\a';
      }
      if ((row->value != (void *)0x0) &&
         (sVar2 = fwrite(row->value,(long)(flat_file->super).record.value_size,1,
                         (FILE *)flat_file->data_file), sVar2 != 1)) {
        return '\a';
      }
      iVar3 = '\0';
    }
  }
  return iVar3;
}

Assistant:

ion_err_t
flat_file_write_row(
	ion_flat_file_t		*flat_file,
	ion_fpos_t			location,
	ion_flat_file_row_t *row
) {
	/* Invalidate the region cache, since data will be mutated. */
	flat_file->current_loaded_region	= -1;
	flat_file->num_in_buffer			= 0;

	if (0 != fseek(flat_file->data_file, flat_file->start_of_data + location * flat_file->row_size, SEEK_SET)) {
		return err_file_bad_seek;
	}

	if (1 != fwrite(&row->row_status, sizeof(row->row_status), 1, flat_file->data_file)) {
		return err_file_write_error;
	}

	if ((NULL != row->key) && (1 != fwrite(row->key, flat_file->super.record.key_size, 1, flat_file->data_file))) {
		return err_file_write_error;
	}

	if ((NULL != row->value) && (1 != fwrite(row->value, flat_file->super.record.value_size, 1, flat_file->data_file))) {
		return err_file_write_error;
	}

	return err_ok;
}